

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sz.h
# Opt level: O1

void duckdb_je_mallocx_cold_1(void)

{
  long lVar1;
  size_t sVar2;
  ulong *in_RDX;
  long in_RSI;
  ulong uVar3;
  long in_RDI;
  ulong uVar4;
  
  uVar3 = -in_RSI & (in_RDI + in_RSI) - 1U;
  if (uVar3 < 0x1001) {
    sVar2 = duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[uVar3 + 7 >> 3]];
  }
  else if (uVar3 < 0x7000000000000001) {
    uVar4 = uVar3 * 2 - 1;
    lVar1 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    uVar4 = -1L << (0x3c - ((byte)lVar1 ^ 0x3f) & 0x3f);
    sVar2 = ~uVar4 + uVar3 & uVar4;
  }
  else {
    sVar2 = 0;
  }
  *in_RDX = sVar2;
  if (sVar2 < 0x4000) {
    return;
  }
  return;
}

Assistant:

JEMALLOC_ALWAYS_INLINE size_t
sz_sa2u(size_t size, size_t alignment) {
	size_t usize;

	assert(alignment != 0 && ((alignment - 1) & alignment) == 0);

	/* Try for a small size class. */
	if (size <= SC_SMALL_MAXCLASS && alignment <= PAGE) {
		/*
		 * Round size up to the nearest multiple of alignment.
		 *
		 * This done, we can take advantage of the fact that for each
		 * small size class, every object is aligned at the smallest
		 * power of two that is non-zero in the base two representation
		 * of the size.  For example:
		 *
		 *   Size |   Base 2 | Minimum alignment
		 *   -----+----------+------------------
		 *     96 |  1100000 |  32
		 *    144 | 10100000 |  32
		 *    192 | 11000000 |  64
		 */
		usize = sz_s2u(ALIGNMENT_CEILING(size, alignment));
		if (usize < SC_LARGE_MINCLASS) {
			return usize;
		}
	}

	/* Large size class.  Beware of overflow. */

	if (unlikely(alignment > SC_LARGE_MAXCLASS)) {
		return 0;
	}

	/* Make sure result is a large size class. */
	if (size <= SC_LARGE_MINCLASS) {
		usize = SC_LARGE_MINCLASS;
	} else {
		usize = sz_s2u(size);
		if (usize < size) {
			/* size_t overflow. */
			return 0;
		}
	}

	/*
	 * Calculate the multi-page mapping that large_palloc() would need in
	 * order to guarantee the alignment.
	 */
	if (usize + sz_large_pad + PAGE_CEILING(alignment) - PAGE < usize) {
		/* size_t overflow. */
		return 0;
	}
	return usize;
}